

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O2

void asio::detail::thread_info_base::deallocate<asio::detail::thread_info_base::default_tag>
               (long *param_1,undefined1 *param_2,ulong param_3)

{
  long lVar1;
  
  if (param_1 != (long *)0x0 && param_3 < 0x3fd) {
    if (*param_1 == 0) {
      lVar1 = 0;
    }
    else {
      if (param_1[1] != 0) goto LAB_0025d65b;
      lVar1 = 1;
    }
    *param_2 = param_2[param_3];
    param_1[lVar1] = (long)param_2;
    return;
  }
LAB_0025d65b:
  free(param_2);
  return;
}

Assistant:

static void deallocate(Purpose, thread_info_base* this_thread,
      void* pointer, std::size_t size)
  {
    if (size <= chunk_size * UCHAR_MAX)
    {
      if (this_thread)
      {
        for (int mem_index = Purpose::begin_mem_index;
            mem_index < Purpose::end_mem_index; ++mem_index)
        {
          if (this_thread->reusable_memory_[mem_index] == 0)
          {
            unsigned char* const mem = static_cast<unsigned char*>(pointer);
            mem[0] = mem[size];
            this_thread->reusable_memory_[mem_index] = pointer;
            return;
          }
        }
      }
    }

    aligned_delete(pointer);
  }